

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

uint llvm::powerOf5(integerPart *dst,uint power)

{
  uint lhsParts;
  integerPart *piVar1;
  integerPart *tmp;
  uint local_38e8;
  uint pc;
  uint n;
  uint result;
  integerPart *pow5;
  integerPart *p2;
  integerPart *p1;
  integerPart scratch [600];
  uint partsCount [16];
  integerPart pow5s [1205];
  uint local_14;
  uint power_local;
  integerPart *dst_local;
  
  partsCount[0xe] = 0x5f5e1;
  partsCount[0xf] = 0;
  memset(scratch + 599,0,0x40);
  scratch[599]._0_4_ = 1;
  pc = 1;
  if (power < 0x4000) {
    pow5 = (integerPart *)&p1;
    *dst = powerOf5::firstEightPowers[power & 7];
    _n = (WordType *)(partsCount + 0xe);
    local_38e8 = 0;
    p2 = dst;
    for (local_14 = power >> 3; piVar1 = p2, local_14 != 0; local_14 = local_14 >> 1) {
      tmp._4_4_ = partsCount[(ulong)local_38e8 - 2];
      if (tmp._4_4_ == 0) {
        lhsParts = partsCount[(ulong)(local_38e8 - 1) - 2];
        APInt::tcFullMultiply(_n,_n + -(ulong)lhsParts,_n + -(ulong)lhsParts,lhsParts,lhsParts);
        tmp._4_4_ = lhsParts * 2;
        if (_n[tmp._4_4_ - 1] == 0) {
          tmp._4_4_ = tmp._4_4_ - 1;
        }
        partsCount[(ulong)local_38e8 - 2] = tmp._4_4_;
      }
      if ((local_14 & 1) != 0) {
        APInt::tcFullMultiply(pow5,p2,_n,pc,tmp._4_4_);
        pc = tmp._4_4_ + pc;
        if (pow5[pc - 1] == 0) {
          pc = pc - 1;
        }
        p2 = pow5;
        pow5 = piVar1;
      }
      _n = _n + tmp._4_4_;
      local_38e8 = local_38e8 + 1;
    }
    if (p2 != dst) {
      APInt::tcAssign(dst,p2,pc);
    }
    return pc;
  }
  __assert_fail("power <= maxExponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x21e,"unsigned int llvm::powerOf5(APFloatBase::integerPart *, unsigned int)");
}

Assistant:

static unsigned int
powerOf5(APFloatBase::integerPart *dst, unsigned int power) {
  static const APFloatBase::integerPart firstEightPowers[] = { 1, 5, 25, 125, 625, 3125, 15625, 78125 };
  APFloatBase::integerPart pow5s[maxPowerOfFiveParts * 2 + 5];
  pow5s[0] = 78125 * 5;

  unsigned int partsCount[16] = { 1 };
  APFloatBase::integerPart scratch[maxPowerOfFiveParts], *p1, *p2, *pow5;
  unsigned int result = 1;
  assert(power <= maxExponent);

#ifndef __clang_analyzer__
  p1 = dst;
  p2 = scratch;

  *p1 = firstEightPowers[power & 7];
  power >>= 3;

  pow5 = pow5s;

  for (unsigned int n = 0; power; power >>= 1, n++) {
    unsigned int pc;

    pc = partsCount[n];

    /* Calculate pow(5,pow(2,n+3)) if we haven't yet.  */
    if (pc == 0) {
      pc = partsCount[n - 1];
      APInt::tcFullMultiply(pow5, pow5 - pc, pow5 - pc, pc, pc);
      pc *= 2;
      if (pow5[pc - 1] == 0)
        pc--;
      partsCount[n] = pc;
    }

    if (power & 1) {
      APFloatBase::integerPart *tmp;

      APInt::tcFullMultiply(p2, p1, pow5, result, pc);
      result += pc;
      if (p2[result - 1] == 0)
        result--;

      /* Now result is in p1 with partsCount parts and p2 is scratch
         space.  */
      tmp = p1;
      p1 = p2;
      p2 = tmp;
    }

    pow5 += pc;
  }

  if (p1 != dst)
    APInt::tcAssign(dst, p1, result);
#endif

  return result;
}